

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

uint __thiscall jpgd::jpeg_decoder::get_bits(jpeg_decoder *this,int num_bits)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int in_ESI;
  long in_RDI;
  uint c2;
  uint c1;
  uint i;
  uint local_4;
  
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else {
    local_4 = *(uint *)(in_RDI + 0x244c) >> (0x20 - (byte)in_ESI & 0x1f);
    iVar1 = *(int *)(in_RDI + 0x2448) - in_ESI;
    *(int *)(in_RDI + 0x2448) = iVar1;
    if (iVar1 < 1) {
      iVar1 = *(int *)(in_RDI + 0x2448) + in_ESI;
      *(int *)(in_RDI + 0x244c) = *(int *)(in_RDI + 0x244c) << ((byte)iVar1 & 0x1f);
      uVar2 = get_char((jpeg_decoder *)CONCAT44(iVar1,local_4));
      uVar3 = get_char((jpeg_decoder *)CONCAT44(iVar1,local_4));
      *(uint *)(in_RDI + 0x244c) = *(uint *)(in_RDI + 0x244c) & 0xffff0000 | uVar2 << 8 | uVar3;
      *(int *)(in_RDI + 0x244c) =
           *(int *)(in_RDI + 0x244c) << (-(char)*(undefined4 *)(in_RDI + 0x2448) & 0x1fU);
      *(int *)(in_RDI + 0x2448) = *(int *)(in_RDI + 0x2448) + 0x10;
      if (*(int *)(in_RDI + 0x2448) < 0) {
        __assert_fail("m_bits_left >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                      ,0x1bc,"uint jpgd::jpeg_decoder::get_bits(int)");
      }
    }
    else {
      *(int *)(in_RDI + 0x244c) = *(int *)(in_RDI + 0x244c) << ((byte)in_ESI & 0x1f);
    }
  }
  return local_4;
}

Assistant:

inline uint jpeg_decoder::get_bits(int num_bits)
	{
		if (!num_bits)
			return 0;

		uint i = m_bit_buf >> (32 - num_bits);

		if ((m_bits_left -= num_bits) <= 0)
		{
			m_bit_buf <<= (num_bits += m_bits_left);

			uint c1 = get_char();
			uint c2 = get_char();
			m_bit_buf = (m_bit_buf & 0xFFFF0000) | (c1 << 8) | c2;

			m_bit_buf <<= -m_bits_left;

			m_bits_left += 16;

			assert(m_bits_left >= 0);
		}
		else
			m_bit_buf <<= num_bits;

		return i;
	}